

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

void __thiscall myGame::Game::redraw(Game *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  pointer ppOVar6;
  Point t;
  Point rb;
  Point zero;
  Point window_coord;
  Point s;
  Point mid;
  Point local_68;
  Point local_60;
  Point local_58;
  Point local_50;
  Point local_48 [2];
  int local_38;
  int local_34;
  
  clear();
  move(1,1);
  Snake::head_coord((Snake *)local_48);
  iVar2 = Snake::get_points(&this->snake);
  printw("Your points: %d (%d, %d)",iVar2,local_48[0].x,local_48[0].y);
  uVar5 = (ulong)(uint)this->H;
  if (0 < this->H) {
    lVar3 = 0;
    do {
      if (0 < this->W) {
        lVar4 = 0;
        do {
          this->map[lVar3][lVar4] = '.';
          lVar4 = lVar4 + 1;
        } while (lVar4 < this->W);
      }
      lVar3 = lVar3 + 1;
      uVar5 = (ulong)this->H;
    } while (lVar3 < (long)uVar5);
  }
  local_38 = this->W / 2;
  local_34 = (int)(((uint)(uVar5 >> 0x1f) & 1) + (int)uVar5) >> 1;
  operator-(&local_50,local_48);
  local_58.x = 0;
  local_58.y = 0;
  uVar5._0_4_ = this->H;
  uVar5._4_4_ = this->W;
  local_60 = (Point)(uVar5 << 0x20 | uVar5 >> 0x20);
  if (Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppOVar6 = Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      Object::get_position((Object *)(local_48 + 1));
      operator-(&local_68,local_48 + 1);
      bVar1 = operator<(&local_58,&local_68);
      if (bVar1) {
        bVar1 = operator<(&local_68,&local_60);
        if (bVar1) {
          this->map[local_68.y][local_68.x] = (*ppOVar6)->ch;
        }
      }
      ppOVar6 = ppOVar6 + 1;
    } while (ppOVar6 !=
             Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (0 < this->H) {
    lVar3 = 0;
    do {
      move((int)lVar3 + 3,3);
      printw("%s",this->map[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->H);
  }
  refresh();
  return;
}

Assistant:

void Game::redraw(){
	clear();
	move(1, 1);
	Point s = snake.head_coord();
	printw("Your points: %d (%d, %d)", snake.get_points(), s.x, s.y);
	for (int i = 0; i < H; i++){
		for (int j = 0; j < W; j++){
			map[i][j] = CHR_NOTHING;
		}
	}
	Point mid = Point(W/2, H/2);
	Point window_coord = s - mid;
	Point zero = Point(0, 0);
	Point rb = Point(W, H);
	for (vector<PObject>::iterator i = Object::obj.begin(); i != Object::obj.end(); i++){
		Point t = (*i)->get_position() - window_coord;
		if (zero < t && t < rb){
			map[t.y][t.x] = (*i)->get_char();
		}

	}
	for (int i = 0; i < H; i++){
		move(i + 3, 3);
		printw("%s", map[i]);
	}
	refresh();
}